

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rsgExpression.cpp
# Opt level: O1

void __thiscall
rsg::FloatLiteral::FloatLiteral
          (FloatLiteral *this,GeneratorState *state,ConstValueRangeAccess valueRange)

{
  pointer pSVar1;
  bool bVar2;
  deUint32 dVar3;
  VariableType *type;
  int ndx;
  long lVar4;
  uint uVar5;
  float fVar6;
  float fVar7;
  float fVar8;
  VariableType local_80;
  
  (this->super_Expression)._vptr_Expression = (_func_int **)&PTR__FloatLiteral_0018cd30;
  type = VariableType::getScalarType(TYPE_FLOAT);
  ValueStorage<64>::ValueStorage(&this->m_value,type);
  local_80.m_typeName._M_dataplus._M_p = (pointer)&local_80.m_typeName.field_2;
  local_80.m_baseType = TYPE_FLOAT;
  local_80.m_precision = PRECISION_NONE;
  local_80.m_typeName._M_string_length = 0;
  local_80.m_typeName.field_2._M_local_buf[0] = '\0';
  local_80.m_numElements = 1;
  local_80.m_elementType = (VariableType *)0x0;
  local_80.m_members.
  super__Vector_base<rsg::VariableType::Member,_std::allocator<rsg::VariableType::Member>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  local_80.m_members.
  super__Vector_base<rsg::VariableType::Member,_std::allocator<rsg::VariableType::Member>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  local_80.m_members.
  super__Vector_base<rsg::VariableType::Member,_std::allocator<rsg::VariableType::Member>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  bVar2 = VariableType::operator==(valueRange.m_type,&local_80);
  VariableType::~VariableType(&local_80);
  fVar6 = 10.0;
  if (bVar2) {
    VariableType::getElementType(valueRange.m_type);
    fVar6 = (valueRange.m_min)->floatVal;
    VariableType::getElementType(valueRange.m_type);
    uVar5 = -(uint)(fVar6 <= -INFINITY);
    fVar8 = (float)(~uVar5 & (uint)fVar6 | uVar5 & 0xc1200000);
    fVar6 = 10.0;
    if ((valueRange.m_max)->floatVal < INFINITY) {
      fVar6 = (valueRange.m_max)->floatVal;
    }
  }
  else {
    fVar8 = -10.0;
  }
  dVar3 = deRandom_getUint32(&state->m_random->m_rnd);
  VariableType::getScalarType(TYPE_FLOAT);
  fVar7 = (float)(int)(dVar3 % ((int)((fVar6 - fVar8) * 4.0) + 2U)) * 0.25 + fVar8;
  pSVar1 = (this->m_value).m_value.super__Vector_base<rsg::Scalar,_std::allocator<rsg::Scalar>_>.
           _M_impl.super__Vector_impl_data._M_start;
  lVar4 = 0;
  do {
    pSVar1[lVar4].intVal =
         ~-(uint)(fVar8 < fVar7) & (uint)fVar8 |
         (-(uint)(fVar6 <= fVar7) & (uint)fVar6 | ~-(uint)(fVar6 <= fVar7) & (uint)fVar7) &
         -(uint)(fVar8 < fVar7);
    lVar4 = lVar4 + 1;
  } while (lVar4 != 0x40);
  return;
}

Assistant:

FloatLiteral::FloatLiteral (GeneratorState& state, ConstValueRangeAccess valueRange)
	: m_value(VariableType::getScalarType(VariableType::TYPE_FLOAT))
{
	float minVal	= -10.0f;
	float maxVal	= +10.0f;
	float step		= 0.25f;

	if (valueRange.getType() == VariableType(VariableType::TYPE_FLOAT, 1))
	{
		minVal = valueRange.getMin().component(0).asFloat();
		maxVal = valueRange.getMax().component(0).asFloat();

		if (Scalar::min<float>() == minVal)
			minVal = -10.0f;

		if (Scalar::max<float>() == maxVal)
			maxVal = +10.0f;
	}

	int numSteps = (int)((maxVal-minVal)/step) + 1;

	const float		value	= deFloatClamp(minVal + step*(float)state.getRandom().getInt(0, numSteps), minVal, maxVal);
	ExecValueAccess	access	= m_value.getValue(VariableType::getScalarType(VariableType::TYPE_FLOAT));

	for (int ndx = 0; ndx < EXEC_VEC_WIDTH; ndx++)
		access.asFloat(ndx) = value;
}